

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O0

void extratLightLine(int imageIndex,Mat *outputImage,structure_light *a)

{
  pointer *this;
  reference __x;
  reference pvVar1;
  reference pvVar2;
  undefined8 uVar3;
  int in_R8D;
  undefined8 in_stack_fffffffffffff598;
  uint uVar4;
  vector<int,_std::allocator<int>_> local_9a8;
  _InputArray local_988;
  allocator local_969;
  string local_968 [32];
  vector<int,_std::allocator<int>_> local_948;
  _InputArray local_928;
  allocator local_909;
  string local_908 [32];
  _InputArray local_8e8;
  _InputArray local_8d0;
  Point_<int> local_8b8;
  Scalar_<double> local_8b0;
  _InputArray local_890;
  _InputOutputArray local_878;
  undefined1 local_860 [8];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> maskPointSet;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> tempPointSet;
  Point maskPoint;
  Point2f tempPoint;
  MatExpr local_818 [352];
  MatExpr local_6b8 [8];
  Mat mask;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_658;
  undefined1 local_640 [8];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  allmaskPoint;
  _InputArray local_608;
  allocator local_5e9;
  string local_5e8 [32];
  undefined1 local_5c8 [32];
  Point_<int> local_5a8;
  _InputArray local_5a0;
  _OutputArray local_588;
  _InputArray local_570;
  Point_<int> local_558;
  Size_<int> local_550;
  Mat local_548 [8];
  Mat element2;
  vector<int,_std::allocator<int>_> local_4e8;
  _InputArray local_4c8;
  allocator local_4a9;
  string local_4a8 [32];
  _OutputArray local_488;
  _InputArray local_470;
  vector<int,_std::allocator<int>_> local_458;
  _InputArray local_438;
  allocator local_419;
  string local_418 [32];
  undefined1 local_3f8 [32];
  Point_<int> local_3d8;
  _InputArray local_3d0;
  _OutputArray local_3b8;
  _InputArray local_3a0;
  Point_<int> local_388;
  Size_<int> local_380;
  Mat local_378 [8];
  Mat element1;
  vector<int,_std::allocator<int>_> local_318;
  _InputArray local_300;
  allocator local_2e1;
  string local_2e0 [32];
  _OutputArray local_2c0;
  _InputArray local_2a8;
  _InputArray local_290;
  undefined1 local_278 [8];
  Mat diff;
  _InputArray local_218;
  _InputArray local_200;
  _InputArray local_1e8;
  _InputArray local_1d0;
  string local_1b8 [8];
  Mat lightImage;
  string local_158 [8];
  Mat oriImage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [8];
  string name2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [8];
  string name1;
  allocator local_61;
  string local_60 [8];
  string index;
  __cxx11 local_40 [8];
  string num;
  structure_light *a_local;
  Mat *outputImage_local;
  int imageIndex_local;
  
  uVar4 = (uint)((ulong)in_stack_fffffffffffff598 >> 0x20);
  std::__cxx11::to_string(local_40,imageIndex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,".jpg",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::operator+((char *)local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "./calib_picture/calib");
  std::operator+(local_98,local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::operator+((char *)local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "./light_picture/light");
  std::operator+(local_d8,local_f8);
  std::__cxx11::string::~string((string *)local_f8);
  cv::imread(local_158,(int)local_98);
  cv::imread(local_1b8,(int)local_d8);
  cv::_InputArray::_InputArray(&local_1d0,(Mat *)local_158);
  cv::_OutputArray::_OutputArray((_OutputArray *)&local_1e8,(Mat *)local_158);
  cv::cvtColor((cv *)&local_1d0,&local_1e8,(_OutputArray *)0x6,0,in_R8D);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&local_1e8);
  cv::_InputArray::~_InputArray(&local_1d0);
  cv::_InputArray::_InputArray(&local_200,(Mat *)local_1b8);
  cv::_OutputArray::_OutputArray((_OutputArray *)&local_218,(Mat *)local_1b8);
  cv::cvtColor((cv *)&local_200,&local_218,(_OutputArray *)0x6,0,in_R8D);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&local_218);
  cv::_InputArray::~_InputArray(&local_200);
  cv::Mat::Mat((Mat *)local_278);
  cv::_InputArray::_InputArray(&local_290,(Mat *)local_158);
  cv::_InputArray::_InputArray(&local_2a8,(Mat *)local_1b8);
  cv::_OutputArray::_OutputArray(&local_2c0,(Mat *)local_278);
  cv::absdiff(&local_290,&local_2a8,&local_2c0);
  cv::_OutputArray::~_OutputArray(&local_2c0);
  cv::_InputArray::~_InputArray(&local_2a8);
  cv::_InputArray::~_InputArray(&local_290);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"./save/diff.jpg",&local_2e1);
  cv::_InputArray::_InputArray(&local_300,(Mat *)local_278);
  local_318.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_318.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_318.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_318);
  cv::imwrite(local_2e0,&local_300,(vector *)&local_318);
  std::vector<int,_std::allocator<int>_>::~vector(&local_318);
  cv::_InputArray::~_InputArray(&local_300);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  cv::Size_<int>::Size_(&local_380,3,3);
  cv::Point_<int>::Point_(&local_388,-1,-1);
  cv::getStructuringElement(local_378,0,&local_380,&local_388);
  cv::_InputArray::_InputArray(&local_3a0,(Mat *)local_278);
  cv::_OutputArray::_OutputArray(&local_3b8,(Mat *)local_278);
  cv::_InputArray::_InputArray(&local_3d0,local_378);
  cv::Point_<int>::Point_(&local_3d8,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::morphologyEx(&local_3a0,&local_3b8,2,&local_3d0,&local_3d8,1,(ulong)uVar4 << 0x20,local_3f8);
  cv::_InputArray::~_InputArray(&local_3d0);
  cv::_OutputArray::~_OutputArray(&local_3b8);
  cv::_InputArray::~_InputArray(&local_3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_418,"./save/open.jpg",&local_419);
  cv::_InputArray::_InputArray(&local_438,(Mat *)local_278);
  local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_458);
  cv::imwrite(local_418,&local_438,(vector *)&local_458);
  std::vector<int,_std::allocator<int>_>::~vector(&local_458);
  cv::_InputArray::~_InputArray(&local_438);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  cv::_InputArray::_InputArray(&local_470,(Mat *)local_278);
  cv::_OutputArray::_OutputArray(&local_488,(Mat *)local_278);
  cv::threshold(&local_470,&local_488,30.0,255.0,0);
  cv::_OutputArray::~_OutputArray(&local_488);
  cv::_InputArray::~_InputArray(&local_470);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a8,"./save/threshold.jpg",&local_4a9);
  cv::_InputArray::_InputArray(&local_4c8,(Mat *)local_278);
  local_4e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_4e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_4e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_4e8);
  cv::imwrite(local_4a8,&local_4c8,(vector *)&local_4e8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_4e8);
  cv::_InputArray::~_InputArray(&local_4c8);
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  cv::Size_<int>::Size_(&local_550,5,5);
  cv::Point_<int>::Point_(&local_558,-1,-1);
  cv::getStructuringElement(local_548,0,&local_550,&local_558);
  cv::_InputArray::_InputArray(&local_570,(Mat *)local_278);
  cv::_OutputArray::_OutputArray(&local_588,(Mat *)local_278);
  cv::_InputArray::_InputArray(&local_5a0,local_548);
  cv::Point_<int>::Point_(&local_5a8,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::erode(&local_570,&local_588,&local_5a0,&local_5a8,1,0,local_5c8);
  cv::_InputArray::~_InputArray(&local_5a0);
  cv::_OutputArray::~_OutputArray(&local_588);
  cv::_InputArray::~_InputArray(&local_570);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e8,"./save/erode.jpg",&local_5e9);
  cv::_InputArray::_InputArray(&local_608,(Mat *)local_278);
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = &allmaskPoint.
          super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)this);
  cv::imwrite(local_5e8,&local_608,(vector *)this);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &allmaskPoint.
              super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::_InputArray::~_InputArray(&local_608);
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            *)local_640);
  local_658.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_658.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_658.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&local_658);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::push_back((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               *)local_640,&local_658);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector(&local_658);
  cv::MatSize::operator()((MatSize *)&tempPoint);
  cv::Mat::zeros(local_818,&tempPoint,0);
  cv::MatExpr::operator_cast_to_Mat(local_6b8);
  cv::MatExpr::~MatExpr(local_818);
  cv::Point_<float>::Point_((Point_<float> *)&maskPoint);
  cv::Point_<int>::Point_
            ((Point_<int> *)
             &tempPointSet.
              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  __x = std::
        vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
        ::operator[](&a->calibImagePoint,(long)imageIndex);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
             &maskPointSet.
              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__x);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_860);
  pvVar1 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                     ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                      &maskPointSet.
                       super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  cv::Point_<float>::operator=((Point_<float> *)&maskPoint,pvVar1);
  tempPointSet.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = cvRound((float)maskPoint.x);
  tempPointSet.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = cvRound((float)maskPoint.y);
  pvVar2 = std::
           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         *)local_640,0);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
            (pvVar2,(value_type *)
                    &tempPointSet.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar1 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                     ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                      &maskPointSet.
                       super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)((a->patternSize).width + -1));
  cv::Point_<float>::operator=((Point_<float> *)&maskPoint,pvVar1);
  tempPointSet.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = cvRound((float)maskPoint.x);
  tempPointSet.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = cvRound((float)maskPoint.y);
  pvVar2 = std::
           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         *)local_640,0);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
            (pvVar2,(value_type *)
                    &tempPointSet.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar1 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                     ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                      &maskPointSet.
                       super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)((a->patternSize).width * (a->patternSize).height + -1));
  cv::Point_<float>::operator=((Point_<float> *)&maskPoint,pvVar1);
  tempPointSet.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = cvRound((float)maskPoint.x);
  tempPointSet.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = cvRound((float)maskPoint.y);
  pvVar2 = std::
           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         *)local_640,0);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
            (pvVar2,(value_type *)
                    &tempPointSet.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar1 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                     ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                      &maskPointSet.
                       super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)((a->patternSize).width * ((a->patternSize).height + -1)));
  cv::Point_<float>::operator=((Point_<float> *)&maskPoint,pvVar1);
  tempPointSet.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = cvRound((float)maskPoint.x);
  tempPointSet.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = cvRound((float)maskPoint.y);
  pvVar2 = std::
           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         *)local_640,0);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
            (pvVar2,(value_type *)
                    &tempPointSet.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::_InputOutputArray::_InputOutputArray(&local_878,(Mat *)local_6b8);
  cv::_InputArray::_InputArray<cv::Point_<int>>
            (&local_890,
             (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              *)local_640);
  cv::Scalar_<double>::Scalar_(&local_8b0,255.0);
  uVar3 = cv::noArray();
  cv::Point_<int>::Point_(&local_8b8);
  cv::drawContours(&local_878,&local_890,0,&local_8b0,0xffffffff,8,uVar3,0x7fffffff,&local_8b8);
  cv::_InputArray::~_InputArray(&local_890);
  cv::_InputOutputArray::~_InputOutputArray(&local_878);
  cv::_OutputArray::_OutputArray((_OutputArray *)&local_8d0,outputImage);
  cv::_InputArray::_InputArray(&local_8e8,(Mat *)local_6b8);
  cv::Mat::copyTo((_OutputArray *)local_278,&local_8d0);
  cv::_InputArray::~_InputArray(&local_8e8);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&local_8d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_908,"./save/mask.jpg",&local_909);
  cv::_InputArray::_InputArray(&local_928,(Mat *)local_6b8);
  local_948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_948);
  cv::imwrite(local_908,&local_928,(vector *)&local_948);
  std::vector<int,_std::allocator<int>_>::~vector(&local_948);
  cv::_InputArray::~_InputArray(&local_928);
  std::__cxx11::string::~string(local_908);
  std::allocator<char>::~allocator((allocator<char> *)&local_909);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_968,"./save/ROI.jpg",&local_969);
  cv::_InputArray::_InputArray(&local_988,outputImage);
  local_9a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_9a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_9a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_9a8);
  cv::imwrite(local_968,&local_988,(vector *)&local_9a8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_9a8);
  cv::_InputArray::~_InputArray(&local_988);
  std::__cxx11::string::~string(local_968);
  std::allocator<char>::~allocator((allocator<char> *)&local_969);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_860);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
             &maskPointSet.
              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cv::Mat::~Mat((Mat *)local_6b8);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)local_640);
  cv::Mat::~Mat(local_548);
  cv::Mat::~Mat(local_378);
  cv::Mat::~Mat((Mat *)local_278);
  cv::Mat::~Mat((Mat *)local_1b8);
  cv::Mat::~Mat((Mat *)local_158);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void extratLightLine(int imageIndex, Mat &outputImage, structure_light &a)
{
    string num = to_string(imageIndex);
    string index = ".jpg";
    string name1 = "./calib_picture/calib" + num + index;
    string name2 = "./light_picture/light" + num + index;

    Mat oriImage = imread(name1);
    Mat lightImage = imread(name2);

    cvtColor(oriImage, oriImage, COLOR_BGR2GRAY);
    cvtColor(lightImage, lightImage, COLOR_BGR2GRAY);
    Mat diff;
    absdiff(oriImage, lightImage, diff);
    imwrite("./save/diff.jpg", diff);

    Mat element1 = getStructuringElement(MORPH_RECT, Size(3, 3));
    morphologyEx(diff, diff, MORPH_OPEN, element1);
    imwrite("./save/open.jpg", diff);

    threshold(diff, diff, 30, 255, THRESH_BINARY);
    imwrite("./save/threshold.jpg", diff);

    Mat element2 = getStructuringElement(MORPH_RECT, Size(5, 5));
    erode(diff, diff, element2);
    imwrite("./save/erode.jpg", diff);

    vector<vector<Point>>  allmaskPoint;
    allmaskPoint.push_back(vector<Point>());
    Mat mask = Mat::zeros(oriImage.size(), CV_8UC1);
    Point2f tempPoint;
    Point maskPoint;
    vector<Point2f> tempPointSet = a.calibImagePoint[imageIndex];
    vector<Point2f> maskPointSet;

    tempPoint = tempPointSet[0];
    maskPoint.x = cvRound(tempPoint.x);
    maskPoint.y = cvRound(tempPoint.y);
    allmaskPoint[0].push_back(maskPoint);

    tempPoint = tempPointSet[a.patternSize.width - 1];
    maskPoint.x = cvRound(tempPoint.x);
    maskPoint.y = cvRound(tempPoint.y);
    allmaskPoint[0].push_back(maskPoint);

    tempPoint = tempPointSet[a.patternSize.width*a.patternSize.height - 1];
    maskPoint.x = cvRound(tempPoint.x);
    maskPoint.y = cvRound(tempPoint.y);
    allmaskPoint[0].push_back(maskPoint);

    tempPoint = tempPointSet[a.patternSize.width*(a.patternSize.height - 1)];
    maskPoint.x = cvRound(tempPoint.x);
    maskPoint.y = cvRound(tempPoint.y);
    allmaskPoint[0].push_back(maskPoint);

    drawContours(mask, allmaskPoint, 0, Scalar(255), FILLED, 8);
    diff.copyTo(outputImage, mask);
    imwrite("./save/mask.jpg", mask);
    imwrite("./save/ROI.jpg", outputImage);

}